

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<double>>
          (internal *this,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  RepeatedField<float> *pRVar3;
  FieldDescriptor *field_00;
  Reflection *this_00;
  
  bVar1 = SplitFieldHasExtraIndirection((FieldDescriptor *)this);
  if (bVar1) {
    return true;
  }
  this_00 = (Reflection *)&stack0xfffffffffffffff0;
  SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<double>>((internal *)this_00);
  bVar1 = ReflectionSchema::IsSplit(&this_00->schema_,field_00);
  if (!bVar1) {
    uVar2 = ReflectionSchema::GetFieldOffsetNonOneof(&this_00->schema_,field_00);
    return (bool)((char)field + (char)uVar2);
  }
  pRVar3 = Reflection::GetRawSplit<google::protobuf::RepeatedField<float>>
                     (this_00,(Message *)field,field_00);
  return SUB81(pRVar3,0);
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}